

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  float *pfVar3;
  undefined4 uVar4;
  unsigned_long uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  SubGridBuildData *pSVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  char *pcVar13;
  size_t i_3;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  char *pcVar20;
  size_t i;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  uint uVar30;
  uint uVar31;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar33;
  uint uVar34;
  uint uVar44;
  uint uVar45;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint uVar52;
  uint uVar56;
  uint uVar57;
  undefined1 auVar53 [16];
  uint uVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint<4> iupper;
  vint<4> ilower;
  uint geomIDs [4];
  AABBNode node;
  uint primID [4];
  uint y [4];
  uint x [4];
  BBox3fa bounds [4];
  undefined8 local_270;
  uint uStack_268;
  uint uStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  undefined1 local_250 [8];
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  uint uStack_238;
  uint uStack_234;
  undefined1 local_230 [16];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  uint local_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  undefined1 local_200 [16];
  float local_1f0 [4];
  float *local_1e0;
  char *local_1d8;
  ulong local_1d0;
  BVHNBuilderT<embree::sse2::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *local_1c8;
  Lock<embree::MutexSys> local_1c0 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  uint auStack_130 [4];
  uint auStack_120 [4];
  uint auStack_110 [4];
  undefined1 local_100 [12];
  float afStack_f4 [49];
  undefined8 uVar46;
  
  local_1c8 = this;
  uVar5 = set->_begin;
  uVar19 = set->_end - uVar5;
  pfVar18 = prims[uVar5].lower.field_0.m128 + 3;
  local_1f0[0] = *pfVar18;
  uVar15 = 1;
  for (uVar21 = 1; uVar22 = (ulong)uVar15, uVar21 < uVar19; uVar21 = uVar21 + 1) {
    fVar48 = pfVar18[uVar21 * 8];
    uVar16 = 0;
    do {
      if (uVar22 == uVar16) {
        uVar15 = uVar15 + 1;
        local_1f0[uVar22] = fVar48;
        break;
      }
      pfVar3 = local_1f0 + uVar16;
      uVar16 = uVar16 + 1;
    } while (fVar48 != *pfVar3);
  }
  local_1d0 = uVar19;
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  local_270 = (MutexSys *)(uVar22 * 0x58);
  this_01 = pTVar6->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_100[8] = true;
    local_100._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_1c0[0].mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_1c0[0].locked = true;
    local_240 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&local_240);
    Lock<embree::MutexSys>::~Lock(local_1c0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_100);
  }
  pTVar6->bytesUsed = (long)&local_270->mutex + pTVar6->bytesUsed;
  sVar14 = pTVar6->cur;
  uVar21 = (ulong)(-(int)sVar14 & 0xf);
  uVar19 = (long)&local_270->mutex + uVar21 + sVar14;
  pTVar6->cur = uVar19;
  if (pTVar6->end < uVar19) {
    pTVar6->cur = sVar14;
    if ((MutexSys *)pTVar6->allocBlockSize < (MutexSys *)((long)local_270 << 2)) {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_270);
    }
    else {
      local_1c0[0].mutex = (MutexSys *)pTVar6->allocBlockSize;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_1c0);
      pTVar6->ptr = pcVar20;
      sVar14 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar14;
      pTVar6->end = (size_t)local_1c0[0].mutex;
      pTVar6->cur = (size_t)local_270;
      if (local_1c0[0].mutex < local_270) {
        pTVar6->cur = 0;
        local_1c0[0].mutex = (MutexSys *)pTVar6->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)local_1c0);
        pTVar6->ptr = pcVar20;
        sVar14 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar14;
        pTVar6->end = (size_t)local_1c0[0].mutex;
        pTVar6->cur = (size_t)local_270;
        if (local_1c0[0].mutex < local_270) {
          pTVar6->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_00477bd5;
        }
      }
      pTVar6->bytesWasted = sVar14;
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar21;
    pcVar20 = pTVar6->ptr + (uVar19 - (long)local_270);
  }
LAB_00477bd5:
  local_1e0 = prims[uVar5].upper.field_0.m128 + 3;
  local_1d8 = pcVar20;
  for (uVar21 = 0; pcVar13 = local_1d8, uVar21 != uVar22; uVar21 = uVar21 + 1) {
    pSVar7 = (local_1c8->createLeafFunc).sgrids;
    uVar16 = 0;
    pfVar18 = local_1e0;
    uVar19 = local_1d0;
    while( true ) {
      bVar23 = uVar19 == 0;
      uVar19 = uVar19 - 1;
      if (bVar23) break;
      if (pfVar18[-4] == local_1f0[uVar21]) {
        fVar48 = *pfVar18;
        auStack_110[uVar16] = (uint)pSVar7[(uint)fVar48].sx;
        auStack_120[uVar16] = (uint)pSVar7[(uint)fVar48].sy;
        auStack_130[uVar16] = pSVar7[(uint)fVar48].primID;
        fVar48 = pfVar18[-6];
        fVar49 = pfVar18[-5];
        fVar51 = pfVar18[-4];
        fVar50 = pfVar18[-3];
        fVar33 = pfVar18[-2];
        fVar11 = pfVar18[-1];
        fVar12 = *pfVar18;
        *(float *)(local_100 + uVar16 * 0x20) = pfVar18[-7];
        *(float *)(local_100 + uVar16 * 0x20 + 4) = fVar48;
        afStack_f4[uVar16 * 8 + -1] = fVar49;
        afStack_f4[uVar16 * 8] = fVar51;
        afStack_f4[uVar16 * 8 + 1] = fVar50;
        afStack_f4[uVar16 * 8 + 2] = fVar33;
        afStack_f4[uVar16 * 8 + 3] = fVar11;
        afStack_f4[uVar16 * 8 + 4] = fVar12;
        uVar16 = (ulong)((int)uVar16 + 1);
      }
      pfVar18 = pfVar18 + 8;
    }
    fVar48 = local_1f0[uVar21];
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar2 = pcVar20 + lVar17 * 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = -1;
      pcVar2[5] = -1;
      pcVar2[6] = -1;
      pcVar2[7] = -1;
    }
    for (lVar17 = 0x30; lVar17 != 0x34; lVar17 = lVar17 + 1) {
      pcVar20[lVar17] = -1;
      pcVar20[lVar17 + -8] = -1;
      pcVar20[lVar17 + -0x10] = -1;
    }
    for (lVar17 = 0x34; lVar17 != 0x38; lVar17 = lVar17 + 1) {
      pcVar20[lVar17] = '\0';
      pcVar20[lVar17 + -8] = '\0';
      pcVar20[lVar17 + -0x10] = '\0';
    }
    *(float *)(local_1d8 + uVar21 * 0x58 + 0x50) = fVar48;
    local_160 = 0x7f8000007f800000;
    uStack_158 = 0x7f8000007f800000;
    local_180 = 0x7f8000007f800000;
    uStack_178 = 0x7f8000007f800000;
    local_1a0 = 0x7f8000007f800000;
    uStack_198 = 0x7f8000007f800000;
    local_150 = 0xff800000ff800000;
    uStack_148 = 0xff800000ff800000;
    local_170 = 0xff800000ff800000;
    uStack_168 = 0xff800000ff800000;
    local_190 = 0xff800000ff800000;
    uStack_188 = 0xff800000ff800000;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      (&local_1c0[0].mutex)[lVar17] = (MutexSys *)0x8;
    }
    for (lVar17 = 0; uVar16 << 2 != lVar17; lVar17 = lVar17 + 4) {
      *(ulong *)(pcVar20 + lVar17 * 2) =
           CONCAT44(*(undefined4 *)((long)auStack_130 + lVar17),
                    *(int *)((long)auStack_120 + lVar17) << 0x10 |
                    (uint)*(ushort *)((long)auStack_110 + lVar17));
      uVar4 = *(undefined4 *)(local_100 + lVar17 * 8 + 4);
      *(undefined4 *)((long)&local_1a0 + lVar17) = *(undefined4 *)(local_100 + lVar17 * 8);
      *(undefined4 *)((long)&local_180 + lVar17) = uVar4;
      *(float *)((long)&local_160 + lVar17) = afStack_f4[lVar17 * 2 + -1];
      *(float *)((long)&local_190 + lVar17) = afStack_f4[lVar17 * 2 + 1];
      *(float *)((long)&local_170 + lVar17) = afStack_f4[lVar17 * 2 + 2];
      *(float *)((long)&local_150 + lVar17) = afStack_f4[lVar17 * 2 + 3];
    }
    unique0x100017aa = uStack_198;
    local_220 = local_1a0;
    fVar48 = (float)local_1a0;
    fVar49 = (float)((ulong)local_1a0 >> 0x20);
    fVar50 = (float)uStack_198;
    fVar51 = (float)((ulong)uStack_198 >> 0x20);
    unique0x100017ba = uStack_188;
    local_250 = local_190;
    local_210 = -(uint)(fVar48 != INFINITY);
    uStack_20c = -(uint)(fVar49 != INFINITY);
    uStack_208 = -(uint)(fVar50 != INFINITY);
    uStack_204 = -(uint)(fVar51 != INFINITY);
    auVar24._4_4_ = fVar48;
    auVar24._0_4_ = fVar49;
    auVar24._8_4_ = fVar51;
    auVar24._12_4_ = fVar50;
    auVar24 = minps(auVar24,_local_220);
    auVar53._0_8_ = auVar24._8_8_;
    auVar53._8_4_ = auVar24._0_4_;
    auVar53._12_4_ = auVar24._4_4_;
    local_200 = minps(auVar53,auVar24);
    auVar25._4_4_ = (int)local_190;
    auVar25._0_4_ = (int)((ulong)local_190 >> 0x20);
    auVar25._8_4_ = (int)((ulong)uStack_188 >> 0x20);
    auVar25._12_4_ = (int)uStack_188;
    auVar24 = maxps(auVar25,_local_250);
    auVar8._4_8_ = uStack_188;
    auVar8._0_4_ = auVar24._4_4_;
    auVar35._0_8_ = auVar8._0_8_ << 0x20;
    auVar35._8_4_ = auVar24._8_4_;
    auVar35._12_4_ = auVar24._12_4_;
    uVar46 = auVar35._8_8_;
    auVar36._8_8_ = auVar24._8_8_;
    auVar36._0_8_ = uVar46;
    if (auVar24._8_4_ <= auVar24._0_4_) {
      auVar37._4_12_ = auVar36._4_12_;
      auVar37._0_4_ = auVar24._0_4_;
      uVar46 = auVar37._0_8_;
    }
    local_260 = local_200._0_4_;
    fVar33 = ((float)uVar46 - local_260) * 1.0000002;
    uVar15 = -(uint)(fVar33 / 255.0 == 0.0);
    auVar59._0_8_ = (ulong)uVar15 & 0xffffffff01000000;
    auVar59._8_8_ = 0;
    local_230 = auVar59 | ZEXT416(~uVar15 & (uint)(fVar33 / 255.0));
    fVar33 = (float)(-(uint)(0.0 < fVar33) & (uint)(255.0 / fVar33));
    fVar48 = fVar48 - local_260;
    fVar49 = fVar49 - local_260;
    fVar51 = fVar51 - local_260;
    fStack_25c = local_260;
    fStack_258 = local_260;
    fStack_254 = local_260;
    fVar50 = floorf((fVar50 - local_260) * fVar33);
    fVar51 = floorf(fVar51 * fVar33);
    fVar48 = floorf(fVar48 * fVar33);
    fVar49 = floorf(fVar49 * fVar33);
    uVar34 = ~((int)fVar48 >> 0x1f) & (int)fVar48;
    uVar44 = ~((int)fVar49 >> 0x1f) & (int)fVar49;
    uVar45 = ~((int)fVar50 >> 0x1f) & (int)fVar50;
    uVar47 = ~((int)fVar51 >> 0x1f) & (int)fVar51;
    fVar48 = (float)local_250._0_4_ - local_260;
    fVar50 = (float)local_250._4_4_ - fStack_25c;
    fVar51 = fStack_244 - fStack_254;
    fVar49 = ceilf((fStack_248 - fStack_258) * fVar33);
    fVar51 = ceilf(fVar51 * fVar33);
    fVar48 = ceilf(fVar48 * fVar33);
    fVar50 = ceilf(fVar50 * fVar33);
    uVar15 = -(uint)(0xfe < (int)fVar48);
    uVar30 = -(uint)(0xfe < (int)fVar50);
    uVar31 = -(uint)(0xfe < (int)fVar49);
    uVar32 = -(uint)(0xfe < (int)fVar51);
    uVar52 = uVar15 & 0xff | ~uVar15 & (int)fVar48;
    uVar56 = uVar30 & 0xff | ~uVar30 & (int)fVar50;
    uVar57 = uVar31 & 0xff | ~uVar31 & (int)fVar49;
    uVar58 = uVar32 & 0xff | ~uVar32 & (int)fVar51;
    uVar15 = -(uint)((float)(int)uVar34 * (float)local_230._0_4_ + local_260 <=
                    (float)local_220._0_4_);
    uVar30 = -(uint)((float)(int)uVar44 * (float)local_230._0_4_ + fStack_25c <=
                    (float)local_220._4_4_);
    uVar31 = -(uint)((float)(int)uVar45 * (float)local_230._0_4_ + fStack_258 <= fStack_218);
    uVar32 = -(uint)((float)(int)uVar47 * (float)local_230._0_4_ + fStack_254 <= fStack_214);
    uVar34 = ~uVar15 & uVar34 - 1 | uVar34 & uVar15;
    uVar44 = ~uVar30 & uVar44 - 1 | uVar44 & uVar30;
    uVar45 = ~uVar31 & uVar45 - 1 | uVar45 & uVar31;
    uVar47 = ~uVar32 & uVar47 - 1 | uVar47 & uVar32;
    uVar15 = -(uint)((float)local_250._0_4_ <=
                    (float)(int)uVar52 * (float)local_230._0_4_ + local_260);
    uVar30 = -(uint)((float)local_250._4_4_ <=
                    (float)(int)uVar56 * (float)local_230._0_4_ + fStack_25c);
    uVar31 = -(uint)(fStack_248 <= (float)(int)uVar57 * (float)local_230._0_4_ + fStack_258);
    uVar32 = -(uint)(fStack_244 <= (float)(int)uVar58 * (float)local_230._0_4_ + fStack_254);
    uVar52 = ~uVar15 & uVar52 + 1 | uVar52 & uVar15;
    uVar56 = ~uVar30 & uVar56 + 1 | uVar56 & uVar30;
    uVar57 = ~uVar31 & uVar57 + 1 | uVar57 & uVar31;
    uVar58 = ~uVar32 & uVar58 + 1 | uVar58 & uVar32;
    uVar15 = -(uint)(0xfe < (int)uVar52);
    uVar30 = -(uint)(0xfe < (int)uVar56);
    uVar31 = -(uint)(0xfe < (int)uVar57);
    uVar32 = -(uint)(0xfe < (int)uVar58);
    local_240 = (ThreadLocal2 *)
                CONCAT44(~uStack_20c & 0xff | ~((int)uVar44 >> 0x1f) & uVar44 & uStack_20c,
                         ~local_210 & 0xff | ~((int)uVar34 >> 0x1f) & uVar34 & local_210);
    uStack_238 = ~uStack_208 & 0xff | ~((int)uVar45 >> 0x1f) & uVar45 & uStack_208;
    uStack_234 = ~uStack_204 & 0xff | ~((int)uVar47 >> 0x1f) & uVar47 & uStack_204;
    local_270 = (MutexSys *)
                CONCAT44((uVar30 & 0xff | ~uVar30 & uVar56) & uStack_20c,
                         (uVar15 & 0xff | ~uVar15 & uVar52) & local_210);
    uStack_268 = (uVar31 & 0xff | ~uVar31 & uVar57) & uStack_208;
    uStack_264 = (uVar32 & 0xff | ~uVar32 & uVar58) & uStack_204;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar20[lVar17 + 0x20] = *(char *)((long)&local_240 + lVar17 * 4);
    }
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar20[lVar17 + 0x24] = *(char *)((long)&local_270 + lVar17 * 4);
    }
    *(undefined4 *)(pcVar13 + uVar21 * 0x58 + 0x38) = local_200._0_4_;
    *(undefined4 *)(pcVar13 + uVar21 * 0x58 + 0x44) = local_230._0_4_;
    unique0x100017ca = uStack_178;
    local_220 = local_180;
    fVar48 = (float)local_180;
    fVar49 = (float)((ulong)local_180 >> 0x20);
    fVar50 = (float)uStack_178;
    fVar51 = (float)((ulong)uStack_178 >> 0x20);
    unique0x100017da = uStack_168;
    local_250 = local_170;
    local_210 = -(uint)(fVar48 != INFINITY);
    uStack_20c = -(uint)(fVar49 != INFINITY);
    uStack_208 = -(uint)(fVar50 != INFINITY);
    uStack_204 = -(uint)(fVar51 != INFINITY);
    auVar26._4_4_ = fVar48;
    auVar26._0_4_ = fVar49;
    auVar26._8_4_ = fVar51;
    auVar26._12_4_ = fVar50;
    auVar24 = minps(auVar26,_local_220);
    auVar54._0_8_ = auVar24._8_8_;
    auVar54._8_4_ = auVar24._0_4_;
    auVar54._12_4_ = auVar24._4_4_;
    local_200 = minps(auVar54,auVar24);
    auVar27._4_4_ = (int)local_170;
    auVar27._0_4_ = (int)((ulong)local_170 >> 0x20);
    auVar27._8_4_ = (int)((ulong)uStack_168 >> 0x20);
    auVar27._12_4_ = (int)uStack_168;
    auVar24 = maxps(auVar27,_local_250);
    auVar9._4_8_ = uStack_168;
    auVar9._0_4_ = auVar24._4_4_;
    auVar38._0_8_ = auVar9._0_8_ << 0x20;
    auVar38._8_4_ = auVar24._8_4_;
    auVar38._12_4_ = auVar24._12_4_;
    uVar46 = auVar38._8_8_;
    auVar39._8_8_ = auVar24._8_8_;
    auVar39._0_8_ = uVar46;
    if (auVar24._8_4_ <= auVar24._0_4_) {
      auVar40._4_12_ = auVar39._4_12_;
      auVar40._0_4_ = auVar24._0_4_;
      uVar46 = auVar40._0_8_;
    }
    local_260 = local_200._0_4_;
    fVar33 = ((float)uVar46 - local_260) * 1.0000002;
    uVar15 = -(uint)(fVar33 / 255.0 == 0.0);
    auVar60._0_8_ = (ulong)uVar15 & 0xffffffff01000000;
    auVar60._8_8_ = 0;
    local_230 = auVar60 | ZEXT416(~uVar15 & (uint)(fVar33 / 255.0));
    fVar33 = (float)(-(uint)(0.0 < fVar33) & (uint)(255.0 / fVar33));
    fVar48 = fVar48 - local_260;
    fVar49 = fVar49 - local_260;
    fVar51 = fVar51 - local_260;
    fStack_25c = local_260;
    fStack_258 = local_260;
    fStack_254 = local_260;
    fVar50 = floorf((fVar50 - local_260) * fVar33);
    fVar51 = floorf(fVar51 * fVar33);
    fVar48 = floorf(fVar48 * fVar33);
    fVar49 = floorf(fVar49 * fVar33);
    uVar34 = ~((int)fVar48 >> 0x1f) & (int)fVar48;
    uVar44 = ~((int)fVar49 >> 0x1f) & (int)fVar49;
    uVar45 = ~((int)fVar50 >> 0x1f) & (int)fVar50;
    uVar47 = ~((int)fVar51 >> 0x1f) & (int)fVar51;
    fVar48 = (float)local_250._0_4_ - local_260;
    fVar50 = (float)local_250._4_4_ - fStack_25c;
    fVar51 = fStack_244 - fStack_254;
    fVar49 = ceilf((fStack_248 - fStack_258) * fVar33);
    fVar51 = ceilf(fVar51 * fVar33);
    fVar48 = ceilf(fVar48 * fVar33);
    fVar50 = ceilf(fVar50 * fVar33);
    uVar15 = -(uint)(0xfe < (int)fVar48);
    uVar30 = -(uint)(0xfe < (int)fVar50);
    uVar31 = -(uint)(0xfe < (int)fVar49);
    uVar32 = -(uint)(0xfe < (int)fVar51);
    uVar52 = uVar15 & 0xff | ~uVar15 & (int)fVar48;
    uVar56 = uVar30 & 0xff | ~uVar30 & (int)fVar50;
    uVar57 = uVar31 & 0xff | ~uVar31 & (int)fVar49;
    uVar58 = uVar32 & 0xff | ~uVar32 & (int)fVar51;
    uVar15 = -(uint)((float)(int)uVar34 * (float)local_230._0_4_ + local_260 <=
                    (float)local_220._0_4_);
    uVar30 = -(uint)((float)(int)uVar44 * (float)local_230._0_4_ + fStack_25c <=
                    (float)local_220._4_4_);
    uVar31 = -(uint)((float)(int)uVar45 * (float)local_230._0_4_ + fStack_258 <= fStack_218);
    uVar32 = -(uint)((float)(int)uVar47 * (float)local_230._0_4_ + fStack_254 <= fStack_214);
    uVar34 = ~uVar15 & uVar34 - 1 | uVar34 & uVar15;
    uVar44 = ~uVar30 & uVar44 - 1 | uVar44 & uVar30;
    uVar45 = ~uVar31 & uVar45 - 1 | uVar45 & uVar31;
    uVar47 = ~uVar32 & uVar47 - 1 | uVar47 & uVar32;
    uVar15 = -(uint)((float)local_250._0_4_ <=
                    (float)(int)uVar52 * (float)local_230._0_4_ + local_260);
    uVar30 = -(uint)((float)local_250._4_4_ <=
                    (float)(int)uVar56 * (float)local_230._0_4_ + fStack_25c);
    uVar31 = -(uint)(fStack_248 <= (float)(int)uVar57 * (float)local_230._0_4_ + fStack_258);
    uVar32 = -(uint)(fStack_244 <= (float)(int)uVar58 * (float)local_230._0_4_ + fStack_254);
    uVar52 = ~uVar15 & uVar52 + 1 | uVar52 & uVar15;
    uVar56 = ~uVar30 & uVar56 + 1 | uVar56 & uVar30;
    uVar57 = ~uVar31 & uVar57 + 1 | uVar57 & uVar31;
    uVar58 = ~uVar32 & uVar58 + 1 | uVar58 & uVar32;
    uVar15 = -(uint)(0xfe < (int)uVar52);
    uVar30 = -(uint)(0xfe < (int)uVar56);
    uVar31 = -(uint)(0xfe < (int)uVar57);
    uVar32 = -(uint)(0xfe < (int)uVar58);
    local_240 = (ThreadLocal2 *)
                CONCAT44(~uStack_20c & 0xff | ~((int)uVar44 >> 0x1f) & uVar44 & uStack_20c,
                         ~local_210 & 0xff | ~((int)uVar34 >> 0x1f) & uVar34 & local_210);
    uStack_238 = ~uStack_208 & 0xff | ~((int)uVar45 >> 0x1f) & uVar45 & uStack_208;
    uStack_234 = ~uStack_204 & 0xff | ~((int)uVar47 >> 0x1f) & uVar47 & uStack_204;
    local_270 = (MutexSys *)
                CONCAT44((uVar30 & 0xff | ~uVar30 & uVar56) & uStack_20c,
                         (uVar15 & 0xff | ~uVar15 & uVar52) & local_210);
    uStack_268 = (uVar31 & 0xff | ~uVar31 & uVar57) & uStack_208;
    uStack_264 = (uVar32 & 0xff | ~uVar32 & uVar58) & uStack_204;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar20[lVar17 + 0x28] = *(char *)((long)&local_240 + lVar17 * 4);
    }
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar20[lVar17 + 0x2c] = *(char *)((long)&local_270 + lVar17 * 4);
    }
    *(undefined4 *)(pcVar13 + uVar21 * 0x58 + 0x3c) = local_200._0_4_;
    *(undefined4 *)(pcVar13 + uVar21 * 0x58 + 0x48) = local_230._0_4_;
    unique0x100017ea = uStack_158;
    local_220 = local_160;
    fVar48 = (float)local_160;
    fVar49 = (float)((ulong)local_160 >> 0x20);
    fVar50 = (float)uStack_158;
    fVar51 = (float)((ulong)uStack_158 >> 0x20);
    unique0x100017fa = uStack_148;
    local_250 = local_150;
    local_210 = -(uint)(fVar48 != INFINITY);
    uStack_20c = -(uint)(fVar49 != INFINITY);
    uStack_208 = -(uint)(fVar50 != INFINITY);
    uStack_204 = -(uint)(fVar51 != INFINITY);
    auVar28._4_4_ = fVar48;
    auVar28._0_4_ = fVar49;
    auVar28._8_4_ = fVar51;
    auVar28._12_4_ = fVar50;
    auVar24 = minps(auVar28,_local_220);
    auVar55._0_8_ = auVar24._8_8_;
    auVar55._8_4_ = auVar24._0_4_;
    auVar55._12_4_ = auVar24._4_4_;
    local_200 = minps(auVar55,auVar24);
    auVar29._4_4_ = (int)local_150;
    auVar29._0_4_ = (int)((ulong)local_150 >> 0x20);
    auVar29._8_4_ = (int)((ulong)uStack_148 >> 0x20);
    auVar29._12_4_ = (int)uStack_148;
    auVar24 = maxps(auVar29,_local_250);
    auVar10._4_8_ = uStack_148;
    auVar10._0_4_ = auVar24._4_4_;
    auVar41._0_8_ = auVar10._0_8_ << 0x20;
    auVar41._8_4_ = auVar24._8_4_;
    auVar41._12_4_ = auVar24._12_4_;
    uVar46 = auVar41._8_8_;
    auVar42._8_8_ = auVar24._8_8_;
    auVar42._0_8_ = uVar46;
    if (auVar24._8_4_ <= auVar24._0_4_) {
      auVar43._4_12_ = auVar42._4_12_;
      auVar43._0_4_ = auVar24._0_4_;
      uVar46 = auVar43._0_8_;
    }
    local_260 = local_200._0_4_;
    fVar33 = ((float)uVar46 - local_260) * 1.0000002;
    uVar15 = -(uint)(fVar33 / 255.0 == 0.0);
    auVar61._0_8_ = (ulong)uVar15 & 0xffffffff01000000;
    auVar61._8_8_ = 0;
    local_230 = auVar61 | ZEXT416(~uVar15 & (uint)(fVar33 / 255.0));
    fVar33 = (float)(-(uint)(0.0 < fVar33) & (uint)(255.0 / fVar33));
    fVar48 = fVar48 - local_260;
    fVar49 = fVar49 - local_260;
    fVar51 = fVar51 - local_260;
    fStack_25c = local_260;
    fStack_258 = local_260;
    fStack_254 = local_260;
    fVar50 = floorf((fVar50 - local_260) * fVar33);
    fVar51 = floorf(fVar51 * fVar33);
    fVar48 = floorf(fVar48 * fVar33);
    fVar49 = floorf(fVar49 * fVar33);
    uVar34 = ~((int)fVar48 >> 0x1f) & (int)fVar48;
    uVar44 = ~((int)fVar49 >> 0x1f) & (int)fVar49;
    uVar45 = ~((int)fVar50 >> 0x1f) & (int)fVar50;
    uVar47 = ~((int)fVar51 >> 0x1f) & (int)fVar51;
    fVar48 = (float)local_250._0_4_ - local_260;
    fVar50 = (float)local_250._4_4_ - fStack_25c;
    fVar51 = fStack_244 - fStack_254;
    fVar49 = ceilf((fStack_248 - fStack_258) * fVar33);
    fVar51 = ceilf(fVar51 * fVar33);
    fVar48 = ceilf(fVar48 * fVar33);
    fVar50 = ceilf(fVar50 * fVar33);
    uVar15 = -(uint)(0xfe < (int)fVar48);
    uVar30 = -(uint)(0xfe < (int)fVar50);
    uVar31 = -(uint)(0xfe < (int)fVar49);
    uVar32 = -(uint)(0xfe < (int)fVar51);
    uVar52 = uVar15 & 0xff | ~uVar15 & (int)fVar48;
    uVar56 = uVar30 & 0xff | ~uVar30 & (int)fVar50;
    uVar57 = uVar31 & 0xff | ~uVar31 & (int)fVar49;
    uVar58 = uVar32 & 0xff | ~uVar32 & (int)fVar51;
    uVar15 = -(uint)((float)(int)uVar34 * (float)local_230._0_4_ + local_260 <=
                    (float)local_220._0_4_);
    uVar30 = -(uint)((float)(int)uVar44 * (float)local_230._0_4_ + fStack_25c <=
                    (float)local_220._4_4_);
    uVar31 = -(uint)((float)(int)uVar45 * (float)local_230._0_4_ + fStack_258 <= fStack_218);
    uVar32 = -(uint)((float)(int)uVar47 * (float)local_230._0_4_ + fStack_254 <= fStack_214);
    uVar34 = ~uVar15 & uVar34 - 1 | uVar34 & uVar15;
    uVar44 = ~uVar30 & uVar44 - 1 | uVar44 & uVar30;
    uVar45 = ~uVar31 & uVar45 - 1 | uVar45 & uVar31;
    uVar47 = ~uVar32 & uVar47 - 1 | uVar47 & uVar32;
    uVar15 = -(uint)((float)local_250._0_4_ <=
                    (float)(int)uVar52 * (float)local_230._0_4_ + local_260);
    uVar30 = -(uint)((float)local_250._4_4_ <=
                    (float)(int)uVar56 * (float)local_230._0_4_ + fStack_25c);
    uVar31 = -(uint)(fStack_248 <= (float)(int)uVar57 * (float)local_230._0_4_ + fStack_258);
    uVar32 = -(uint)(fStack_244 <= (float)(int)uVar58 * (float)local_230._0_4_ + fStack_254);
    uVar52 = ~uVar15 & uVar52 + 1 | uVar52 & uVar15;
    uVar56 = ~uVar30 & uVar56 + 1 | uVar56 & uVar30;
    uVar57 = ~uVar31 & uVar57 + 1 | uVar57 & uVar31;
    uVar58 = ~uVar32 & uVar58 + 1 | uVar58 & uVar32;
    uVar15 = -(uint)(0xfe < (int)uVar52);
    uVar30 = -(uint)(0xfe < (int)uVar56);
    uVar31 = -(uint)(0xfe < (int)uVar57);
    uVar32 = -(uint)(0xfe < (int)uVar58);
    local_240 = (ThreadLocal2 *)
                CONCAT44(~uStack_20c & 0xff | ~((int)uVar44 >> 0x1f) & uVar44 & uStack_20c,
                         ~local_210 & 0xff | ~((int)uVar34 >> 0x1f) & uVar34 & local_210);
    uStack_238 = ~uStack_208 & 0xff | ~((int)uVar45 >> 0x1f) & uVar45 & uStack_208;
    uStack_234 = ~uStack_204 & 0xff | ~((int)uVar47 >> 0x1f) & uVar47 & uStack_204;
    local_270 = (MutexSys *)
                CONCAT44((uVar30 & 0xff | ~uVar30 & uVar56) & uStack_20c,
                         (uVar15 & 0xff | ~uVar15 & uVar52) & local_210);
    uStack_268 = (uVar31 & 0xff | ~uVar31 & uVar57) & uStack_208;
    uStack_264 = (uVar32 & 0xff | ~uVar32 & uVar58) & uStack_204;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar20[lVar17 + 0x30] = *(char *)((long)&local_240 + lVar17 * 4);
    }
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar20[lVar17 + 0x34] = *(char *)((long)&local_270 + lVar17 * 4);
    }
    *(undefined4 *)(pcVar13 + uVar21 * 0x58 + 0x40) = local_200._0_4_;
    *(undefined4 *)(pcVar13 + uVar21 * 0x58 + 0x4c) = local_230._0_4_;
    pcVar20 = pcVar20 + 0x58;
  }
  uVar21 = 7;
  if (uVar22 < 7) {
    uVar21 = uVar22;
  }
  return (NodeRef)(uVar21 | (ulong)local_1d8 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }